

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O0

PolarPosition * ear::toPolarPosition(CartesianPosition position)

{
  CartesianPosition position_00;
  PolarPosition *in_RDI;
  double azimuth;
  double elevation;
  double distance;
  PolarPosition *this;
  Matrix<double,_3,_1,_0,_3,_1> local_80;
  Matrix<double,_3,_1,_0,_3,_1> local_68;
  Matrix<double,_3,_1,_0,_3,_1> local_50;
  double local_30;
  double local_28;
  undefined1 local_20 [8];
  Vector3d cart_array;
  
  local_30 = position.X;
  local_28 = position.Y;
  position_00.Z = (double)in_RDI;
  position_00.X = (double)SUB168(position._0_16_,0);
  position_00.Y = (double)SUB168(position._0_16_,8);
  this = in_RDI;
  toCartesianVector3d(position_00);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_50,(Matrix<double,_3,_1,_0,_3,_1> *)local_20);
  azimuth = ear::azimuth(&local_50);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_68,(Matrix<double,_3,_1,_0,_3,_1> *)local_20);
  elevation = ear::elevation(&local_68);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_80,(Matrix<double,_3,_1,_0,_3,_1> *)local_20);
  distance = ear::distance(&local_80);
  PolarPosition::PolarPosition(this,azimuth,elevation,distance);
  return in_RDI;
}

Assistant:

PolarPosition toPolarPosition(CartesianPosition position) {
    auto cart_array = toCartesianVector3d(position);
    return PolarPosition(azimuth(cart_array), elevation(cart_array),
                         distance(cart_array));
  }